

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_volume_status(REF_GRID ref_grid)

{
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  REF_STATUS RVar1;
  uint uVar2;
  undefined8 uVar3;
  int cell;
  char *pcVar4;
  REF_DBL max_volume;
  REF_DBL min_volume;
  REF_DBL volume;
  REF_INT nodes [27];
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  REF_MPI local_b0;
  REF_INT local_a8 [30];
  
  local_b0 = ref_grid->mpi;
  ref_cell = ref_grid->cell[8];
  local_c0 = 1e+200;
  local_c8 = -1e+200;
  if (ref_cell->max < 1) {
    local_d0 = 1e+200;
    local_d8 = -1e+200;
  }
  else {
    cell = 0;
    local_d0 = 1e+200;
    local_d8 = -1e+200;
    do {
      RVar1 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (RVar1 == 0) {
        uVar2 = ref_node_tet_vol(ref_grid->node,local_a8,&local_b8);
        if (uVar2 != 0) {
          pcVar4 = "vol";
          uVar3 = 0x1e2;
          goto LAB_001d8f17;
        }
        if (local_b8 <= local_d0) {
          local_d0 = local_b8;
        }
        local_c8 = local_d8;
        local_c0 = local_d0;
        if (local_d8 <= local_b8) {
          local_d8 = local_b8;
          local_c8 = local_b8;
        }
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  ref_mpi = local_b0;
  local_b8 = local_d0;
  uVar2 = ref_mpi_min(local_b0,&local_b8,&local_c0,3);
  if (uVar2 == 0) {
    uVar2 = ref_mpi_bcast(ref_mpi,&local_c0,1,3);
    if (uVar2 == 0) {
      local_b8 = local_d8;
      uVar2 = ref_mpi_max(ref_mpi,&local_b8,&local_c8,3);
      if (uVar2 == 0) {
        uVar2 = ref_mpi_bcast(ref_mpi,&local_c8,1,3);
        if (uVar2 == 0) {
          if (ref_grid->mpi->id != 0) {
            return 0;
          }
          printf("volume %.5e %.5e\n",local_c0,local_c8);
          return 0;
        }
        pcVar4 = "min";
        uVar3 = 0x1eb;
      }
      else {
        pcVar4 = "mpi max";
        uVar3 = 0x1ea;
      }
    }
    else {
      pcVar4 = "min";
      uVar3 = 0x1e8;
    }
  }
  else {
    pcVar4 = "mpi min";
    uVar3 = 0x1e7;
  }
LAB_001d8f17:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
         uVar3,"ref_validation_volume_status",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_validation_volume_status(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL min_volume, max_volume;
  REF_DBL volume;

  min_volume = REF_DBL_MAX;
  max_volume = REF_DBL_MIN;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tet_vol(ref_grid_node(ref_grid), nodes, &volume), "vol");
    min_volume = MIN(min_volume, volume);
    max_volume = MAX(max_volume, volume);
  }
  volume = min_volume;
  RSS(ref_mpi_min(ref_mpi, &volume, &min_volume, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_volume, 1, REF_DBL_TYPE), "min");
  volume = max_volume;
  RSS(ref_mpi_max(ref_mpi, &volume, &max_volume, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_volume, 1, REF_DBL_TYPE), "min");

  if (ref_grid_once(ref_grid))
    printf("volume %.5e %.5e\n", min_volume, max_volume);

  return REF_SUCCESS;
}